

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O0

uint llvm::dwarf::LanguageVersion(SourceLanguage Lang)

{
  undefined4 local_c;
  SourceLanguage Lang_local;
  
  if (Lang == DW_LANG_C89) {
    local_c = 2;
  }
  else if (Lang == DW_LANG_C) {
    local_c = 2;
  }
  else if (Lang == DW_LANG_Ada83) {
    local_c = 2;
  }
  else if (Lang == DW_LANG_C_plus_plus) {
    local_c = 2;
  }
  else if (Lang == DW_LANG_Cobol74) {
    local_c = 2;
  }
  else if (Lang == DW_LANG_Cobol85) {
    local_c = 2;
  }
  else if (Lang == DW_LANG_Fortran77) {
    local_c = 2;
  }
  else if (Lang == DW_LANG_Fortran90) {
    local_c = 2;
  }
  else if (Lang == DW_LANG_Pascal83) {
    local_c = 2;
  }
  else if (Lang == DW_LANG_Modula2) {
    local_c = 2;
  }
  else if (Lang == DW_LANG_Java) {
    local_c = 3;
  }
  else if (Lang == DW_LANG_C99) {
    local_c = 3;
  }
  else if (Lang == DW_LANG_Ada95) {
    local_c = 3;
  }
  else if (Lang == DW_LANG_Fortran95) {
    local_c = 3;
  }
  else if (Lang == DW_LANG_PLI) {
    local_c = 3;
  }
  else if (Lang == DW_LANG_ObjC) {
    local_c = 3;
  }
  else if (Lang == DW_LANG_ObjC_plus_plus) {
    local_c = 3;
  }
  else if (Lang == DW_LANG_UPC) {
    local_c = 3;
  }
  else if (Lang == DW_LANG_D) {
    local_c = 3;
  }
  else if (Lang == DW_LANG_Python) {
    local_c = 4;
  }
  else if (Lang == DW_LANG_OpenCL) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_Go) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_Modula3) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_Haskell) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_C_plus_plus_03) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_C_plus_plus_11) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_OCaml) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_Rust) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_C11) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_Swift) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_Julia) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_Dylan) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_C_plus_plus_14) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_Fortran03) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_Fortran08) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_RenderScript) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_BLISS) {
    local_c = 5;
  }
  else if (Lang == DW_LANG_Mips_Assembler) {
    local_c = 0;
  }
  else if (Lang == DW_LANG_GOOGLE_RenderScript) {
    local_c = 0;
  }
  else if (Lang == DW_LANG_BORLAND_Delphi) {
    local_c = 0;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

unsigned llvm::dwarf::LanguageVersion(dwarf::SourceLanguage Lang) {
  switch (Lang) {
  default:
    return 0;
#define HANDLE_DW_LANG(ID, NAME, LOWER_BOUND, VERSION, VENDOR)                 \
  case DW_LANG_##NAME:                                                         \
    return VERSION;
#include "llvm/BinaryFormat/Dwarf.def"
  }
}